

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O0

Error asmjit::X86Logging_formatImmShuf(StringBuilder *sb,uint32_t u8,uint32_t bits,uint32_t count)

{
  uint uVar1;
  Error EVar2;
  uint in_ECX;
  byte in_DL;
  uint in_ESI;
  Error _err_2;
  Error _err_1;
  uint32_t value;
  uint32_t i;
  uint32_t mask;
  Error _err;
  uint32_t in_stack_00000044;
  size_t in_stack_00000048;
  uint32_t in_stack_00000054;
  uint64_t in_stack_00000058;
  uint32_t in_stack_00000064;
  StringBuilder *in_stack_00000068;
  undefined4 in_stack_ffffffffffffff80;
  char c;
  uint in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff8c;
  uint local_64;
  Error local_58;
  
  local_58 = StringBuilder::_opChar
                       ((StringBuilder *)
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        in_stack_ffffffffffffff84,(char)((uint)in_stack_ffffffffffffff80 >> 0x18));
  if (local_58 == 0) {
    uVar1 = (1 << (in_DL & 0x1f)) - 1;
    local_64 = in_ESI;
    for (uVar3 = 0; c = (char)((uint)in_stack_ffffffffffffff80 >> 0x18), uVar3 < in_ECX;
        uVar3 = uVar3 + 1) {
      in_stack_ffffffffffffff84 = local_64 & uVar1;
      if (uVar3 != 0) {
        EVar2 = StringBuilder::_opChar
                          ((StringBuilder *)CONCAT44(uVar1,uVar3),in_stack_ffffffffffffff84,c);
        if (EVar2 != 0) {
          return EVar2;
        }
        in_stack_ffffffffffffff80 = 0;
      }
      EVar2 = StringBuilder::_opNumber
                        (in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000054,
                         in_stack_00000048,in_stack_00000044);
      if (EVar2 != 0) {
        return EVar2;
      }
      local_64 = local_64 >> (in_DL & 0x1f);
    }
    local_58 = StringBuilder::_opChar
                         ((StringBuilder *)CONCAT44(uVar1,uVar3),in_stack_ffffffffffffff84,c);
  }
  return local_58;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error X86Logging_formatImmShuf(StringBuilder& sb, uint32_t u8, uint32_t bits, uint32_t count) noexcept {
  ASMJIT_PROPAGATE(sb.appendChar('<'));
  uint32_t mask = (1 << bits) - 1;

  for (uint32_t i = 0; i < count; i++, u8 >>= bits) {
    uint32_t value = u8 & mask;
    if (i != 0)
      ASMJIT_PROPAGATE(sb.appendChar('|'));
    ASMJIT_PROPAGATE(sb.appendUInt(value));
  }

  return sb.appendChar('>');
}